

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O1

void jsonnet_tla_var(JsonnetVm *vm,char *key,char *val)

{
  mapped_type *this;
  allocator<char> local_8a;
  allocator<char> local_89;
  long *local_88 [2];
  long local_78 [2];
  bool local_68;
  key_type local_60;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,val,&local_89);
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)local_88,local_40,local_38 + (long)local_40);
  local_68 = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,key,&local_8a);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
         ::operator[](&vm->tla,&local_60);
  std::__cxx11::string::operator=((string *)this,(string *)local_88);
  this->isCode = local_68;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

void jsonnet_tla_var(JsonnetVm *vm, const char *key, const char *val)
{
    vm->tla[key] = VmExt(val, false);
}